

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGImpactCollisionAlgorithm.cpp
# Opt level: O2

void __thiscall
btGImpactCollisionAlgorithm::gimpacttrimeshpart_vs_plane_collision
          (btGImpactCollisionAlgorithm *this,btCollisionObjectWrapper *body0Wrap,
          btCollisionObjectWrapper *body1Wrap,btGImpactMeshShapePart *shape0,
          btStaticPlaneShape *shape1,bool swapped)

{
  btTransform *pbVar1;
  eBT_PLANE_INTERSECTION_TYPE eVar2;
  btCollisionObjectWrapper *body1Wrap_00;
  btCollisionObjectWrapper *body0Wrap_00;
  btVector3 *normal;
  uint vertex_index;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float fVar3;
  btVector4 plane;
  btTransform orgtrans0;
  btTransform orgtrans1;
  btVector3 local_108;
  btVector3 local_f8;
  btVector3 local_e8;
  btAABB local_d8;
  btTransform local_b8;
  btTransform local_78;
  
  pbVar1 = body0Wrap->m_worldTransform;
  local_b8.m_basis.m_el[0].m_floats._0_8_ = *(undefined8 *)(pbVar1->m_basis).m_el[0].m_floats;
  local_b8.m_basis.m_el[0].m_floats._8_8_ = *(undefined8 *)((pbVar1->m_basis).m_el[0].m_floats + 2);
  local_b8.m_basis.m_el[1].m_floats._0_8_ = *(undefined8 *)(pbVar1->m_basis).m_el[1].m_floats;
  local_b8.m_basis.m_el[1].m_floats._8_8_ = *(undefined8 *)((pbVar1->m_basis).m_el[1].m_floats + 2);
  local_b8.m_basis.m_el[2].m_floats._0_8_ = *(undefined8 *)(pbVar1->m_basis).m_el[2].m_floats;
  local_b8.m_basis.m_el[2].m_floats._8_8_ = *(undefined8 *)((pbVar1->m_basis).m_el[2].m_floats + 2);
  local_b8.m_origin.m_floats._0_8_ = *(undefined8 *)(pbVar1->m_origin).m_floats;
  local_b8.m_origin.m_floats._8_8_ = *(undefined8 *)((pbVar1->m_origin).m_floats + 2);
  pbVar1 = body1Wrap->m_worldTransform;
  local_78.m_basis.m_el[0].m_floats._0_8_ = *(undefined8 *)(pbVar1->m_basis).m_el[0].m_floats;
  local_78.m_basis.m_el[0].m_floats._8_8_ = *(undefined8 *)((pbVar1->m_basis).m_el[0].m_floats + 2);
  local_78.m_basis.m_el[1].m_floats._0_8_ = *(undefined8 *)(pbVar1->m_basis).m_el[1].m_floats;
  local_78.m_basis.m_el[1].m_floats._8_8_ = *(undefined8 *)((pbVar1->m_basis).m_el[1].m_floats + 2);
  local_78.m_basis.m_el[2].m_floats._0_8_ = *(undefined8 *)(pbVar1->m_basis).m_el[2].m_floats;
  local_78.m_basis.m_el[2].m_floats._8_8_ = *(undefined8 *)((pbVar1->m_basis).m_el[2].m_floats + 2);
  local_78.m_origin.m_floats._0_8_ = *(undefined8 *)(pbVar1->m_origin).m_floats;
  local_78.m_origin.m_floats._8_8_ = *(undefined8 *)((pbVar1->m_origin).m_floats + 2);
  btPlaneShape::get_plane_equation_transformed
            ((btPlaneShape *)shape1,&local_78,(btVector4 *)&local_108);
  (*(shape0->super_btGImpactShapeInterface).super_btConcaveShape.super_btCollisionShape.
    _vptr_btCollisionShape[2])(shape0,&local_b8,&local_d8,&local_d8.m_max);
  (*(shape1->super_btConcaveShape).super_btCollisionShape._vptr_btCollisionShape[0xc])(shape1);
  fVar3 = local_d8.m_min.m_floats[1];
  local_d8.m_min.m_floats[0] = local_d8.m_min.m_floats[0] - extraout_XMM0_Da;
  local_d8.m_min.m_floats[1] = fVar3 - extraout_XMM0_Da;
  local_d8.m_min.m_floats[2] = local_d8.m_min.m_floats[2] - extraout_XMM0_Da;
  fVar3 = local_d8.m_max.m_floats[1];
  local_d8.m_max.m_floats[0] = local_d8.m_max.m_floats[0] + extraout_XMM0_Da;
  local_d8.m_max.m_floats[1] = fVar3 + extraout_XMM0_Da;
  local_d8.m_max.m_floats[2] = extraout_XMM0_Da + local_d8.m_max.m_floats[2];
  eVar2 = btAABB::plane_classify(&local_d8,(btVector4 *)&local_108);
  if (eVar2 == BT_CONST_COLLIDE_PLANE) {
    (*(shape0->super_btGImpactShapeInterface).super_btConcaveShape.super_btCollisionShape.
      _vptr_btCollisionShape[0x1c])(shape0);
    (*(shape0->super_btGImpactShapeInterface).super_btConcaveShape.super_btCollisionShape.
      _vptr_btCollisionShape[0xc])(shape0);
    (*(shape1->super_btConcaveShape).super_btCollisionShape._vptr_btCollisionShape[0xc])(shape1);
    vertex_index = *(uint *)&shape0->field_0xf0;
    while (vertex_index = vertex_index - 1, vertex_index != 0xffffffff) {
      btGImpactMeshShapePart::TrimeshPrimitiveManager::get_vertex
                (&shape0->m_primitive_manager,vertex_index,&local_e8);
      local_e8 = btTransform::operator()(&local_b8,&local_e8);
      fVar3 = ((local_e8.m_floats[2] * local_108.m_floats[2] +
               local_e8.m_floats[0] * local_108.m_floats[0] +
               local_e8.m_floats[1] * local_108.m_floats[1]) - local_108.m_floats[3]) -
              (extraout_XMM0_Da_01 + extraout_XMM0_Da_00);
      if (fVar3 < 0.0) {
        if (swapped) {
          local_f8.m_floats[2] = -local_108.m_floats[2];
          local_f8.m_floats[0] = (btScalar)(int)(local_108.m_floats._0_8_ ^ 0x8000000080000000);
          local_f8.m_floats[1] =
               (btScalar)(int)((local_108.m_floats._0_8_ ^ 0x8000000080000000) >> 0x20);
          local_f8.m_floats[3] = 0.0;
          normal = &local_f8;
          body1Wrap_00 = body0Wrap;
          body0Wrap_00 = body1Wrap;
        }
        else {
          normal = &local_108;
          body1Wrap_00 = body1Wrap;
          body0Wrap_00 = body0Wrap;
        }
        addContactPoint(this,body0Wrap_00,body1Wrap_00,&local_e8,normal,fVar3);
      }
    }
    (*(shape0->super_btGImpactShapeInterface).super_btConcaveShape.super_btCollisionShape.
      _vptr_btCollisionShape[0x1d])(shape0);
  }
  return;
}

Assistant:

void btGImpactCollisionAlgorithm::gimpacttrimeshpart_vs_plane_collision(
					  const btCollisionObjectWrapper * body0Wrap,
					  const btCollisionObjectWrapper * body1Wrap,
					  const btGImpactMeshShapePart * shape0,
					  const btStaticPlaneShape * shape1,bool swapped)
{


	btTransform orgtrans0 = body0Wrap->getWorldTransform();
	btTransform orgtrans1 = body1Wrap->getWorldTransform();

	const btPlaneShape * planeshape = static_cast<const btPlaneShape *>(shape1);
	btVector4 plane;
	planeshape->get_plane_equation_transformed(orgtrans1,plane);

	//test box against plane

	btAABB tribox;
	shape0->getAabb(orgtrans0,tribox.m_min,tribox.m_max);
	tribox.increment_margin(planeshape->getMargin());

	if( tribox.plane_classify(plane)!= BT_CONST_COLLIDE_PLANE) return;

	shape0->lockChildShapes();

	btScalar margin = shape0->getMargin() + planeshape->getMargin();

	btVector3 vertex;
	int vi = shape0->getVertexCount();
	while(vi--)
	{
		shape0->getVertex(vi,vertex);
		vertex = orgtrans0(vertex);

		btScalar distance = vertex.dot(plane) - plane[3] - margin;

		if(distance<0.0)//add contact
		{
			if(swapped)
			{
				addContactPoint(body1Wrap, body0Wrap,
					vertex,
					-plane,
					distance);
			}
			else
			{
				addContactPoint(body0Wrap, body1Wrap,
					vertex,
					plane,
					distance);
			}
		}
	}

	shape0->unlockChildShapes();
}